

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O3

QSize __thiscall QtMWidgets::PickerPrivate::minimumSizeHint(PickerPrivate *this,QStyleOption *opt)

{
  int iVar1;
  int extraout_var;
  QSize QVar2;
  int extraout_var_00;
  QByteArrayView QVar3;
  QArrayData *local_38 [4];
  
  QVar3.m_data = (storage_type *)0x1;
  QVar3.m_size = (qsizetype)local_38;
  QString::fromLatin1(QVar3);
  QFontMetrics::boundingRect((QString *)(opt + 0x20));
  this->stringHeight = (extraout_var_00 - extraout_var) + 1;
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  iVar1 = QFontMetrics::averageCharWidth();
  this->itemSideMargin = iVar1 * 3;
  this->itemTopMargin = this->stringHeight / 3;
  iVar1 = QFontMetrics::averageCharWidth();
  QVar2.ht = (this->stringHeight + this->itemTopMargin) * this->itemsCount - this->itemTopMargin;
  QVar2.wd = (this->minStringLength + 2) * iVar1 + this->itemSideMargin * 2;
  return QVar2;
}

Assistant:

QSize
PickerPrivate::minimumSizeHint( const QStyleOption & opt )
{
	stringHeight = opt.fontMetrics.boundingRect( QLatin1String( "A" ) ).height();

	itemSideMargin = opt.fontMetrics.averageCharWidth() * 3;

	itemTopMargin = stringHeight / 3;

	const int minStringWidth = opt.fontMetrics.averageCharWidth() *
		( minStringLength + 2 );
	const int widgetWidth = minStringWidth + 2 * itemSideMargin;
	const int widgetHeight = ( stringHeight + itemTopMargin ) *
		itemsCount - itemTopMargin;

	return QSize( widgetWidth, widgetHeight );
}